

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

bool __thiscall VmaMappingHysteresis::PostFree(VmaMappingHysteresis *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  
  bVar4 = this->m_ExtraMapping == 1;
  if (bVar4) {
    uVar3 = this->m_MajorCounter + 1;
    this->m_MajorCounter = uVar3;
    if (uVar3 < 7) {
      return false;
    }
    uVar2 = 0;
    if (uVar3 <= this->m_MinorCounter + 1) goto LAB_001c3b8c;
    this->m_MajorCounter = 0;
    this->m_ExtraMapping = 0;
  }
  else {
    uVar2 = this->m_MajorCounter;
    iVar1 = 1;
    if (uVar2 <= this->m_MinorCounter) {
      if (uVar2 == 0) {
        return false;
      }
      this->m_MajorCounter = uVar2 - 1;
      iVar1 = -1;
    }
    uVar2 = iVar1 + this->m_MinorCounter;
  }
  this->m_MinorCounter = uVar2;
  uVar2 = (uint)bVar4;
LAB_001c3b8c:
  return SUB41(uVar2,0);
}

Assistant:

bool PostFree()
    {
#if VMA_MAPPING_HYSTERESIS_ENABLED
        if(m_ExtraMapping == 1)
        {
            ++m_MajorCounter;
            if(m_MajorCounter >= COUNTER_MIN_EXTRA_MAPPING &&
                m_MajorCounter > m_MinorCounter + 1)
            {
                m_ExtraMapping = 0;
                m_MajorCounter = 0;
                m_MinorCounter = 0;
                return true;
            }
        }
        else // m_ExtraMapping == 0
            PostMinorCounter();
#endif // #if VMA_MAPPING_HYSTERESIS_ENABLED
        return false;
    }